

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_hpf_process_pcm_frames
                    (ma_hpf *pHPF,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ma_hpf1 *pmVar12;
  ma_biquad_coefficient *pmVar13;
  ma_hpf2 *pmVar14;
  int iVar15;
  int iVar16;
  ma_result mVar17;
  ulong uVar18;
  ulong uVar19;
  undefined2 uVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  float *pFramesOutF32;
  float fVar26;
  float fVar27;
  float fVar28;
  
  if (pHPF == (ma_hpf *)0x0) {
    return MA_INVALID_ARGS;
  }
  if (pFramesOut == pFramesIn) {
    uVar19 = 0xffffffffffffffff;
    lVar22 = 0;
    do {
      uVar19 = uVar19 + 1;
      if (pHPF->hpf1Count <= uVar19) {
        uVar19 = 0xffffffffffffffff;
        lVar22 = 0;
        do {
          uVar19 = uVar19 + 1;
          if (pHPF->hpf2Count <= uVar19) {
            return MA_SUCCESS;
          }
          mVar17 = ma_hpf2_process_pcm_frames
                             ((ma_hpf2 *)((long)&(pHPF->pHPF2->bq).format + lVar22),pFramesOut,
                              pFramesOut,frameCount);
          lVar22 = lVar22 + 0x40;
        } while (mVar17 == MA_SUCCESS);
        return mVar17;
      }
      mVar17 = ma_hpf1_process_pcm_frames
                         ((ma_hpf1 *)((long)&pHPF->pHPF1->format + lVar22),pFramesOut,pFramesOut,
                          frameCount);
      lVar22 = lVar22 + 0x28;
    } while (mVar17 == MA_SUCCESS);
    return mVar17;
  }
  if (pHPF->format == ma_format_f32) {
    for (uVar19 = 0; uVar19 < frameCount; uVar19 = (ulong)((int)uVar19 + 1)) {
      memcpy(pFramesOut,pFramesIn,
             (ulong)(*(int *)(&DAT_00176420 + (ulong)pHPF->format * 4) * pHPF->channels));
      for (uVar18 = 0; uVar18 < pHPF->hpf1Count; uVar18 = uVar18 + 1) {
        pmVar12 = pHPF->pHPF1;
        uVar6 = pmVar12[uVar18].channels;
        fVar26 = 1.0 - pmVar12[uVar18].a.f32;
        for (uVar23 = 0; uVar6 != uVar23; uVar23 = uVar23 + 1) {
          pmVar13 = pmVar12[uVar18].pR1;
          fVar27 = *(float *)((long)pFramesOut + uVar23 * 4) * (1.0 - fVar26) +
                   pmVar13[uVar23].f32 * -fVar26;
          *(float *)((long)pFramesOut + uVar23 * 4) = fVar27;
          pmVar13[uVar23].f32 = fVar27;
        }
      }
      for (uVar18 = 0; uVar18 < pHPF->hpf2Count; uVar18 = uVar18 + 1) {
        pmVar14 = pHPF->pHPF2;
        uVar6 = pmVar14[uVar18].bq.channels;
        fVar26 = pmVar14[uVar18].bq.b0.f32;
        fVar27 = pmVar14[uVar18].bq.b1.f32;
        fVar1 = pmVar14[uVar18].bq.b2.f32;
        fVar2 = pmVar14[uVar18].bq.a1.f32;
        fVar3 = pmVar14[uVar18].bq.a2.f32;
        for (uVar23 = 0; uVar6 != uVar23; uVar23 = uVar23 + 1) {
          pmVar13 = pmVar14[uVar18].bq.pR1;
          fVar4 = *(float *)((long)pFramesOut + uVar23 * 4);
          fVar28 = fVar26 * fVar4 + pmVar13[uVar23].f32;
          fVar5 = pmVar14[uVar18].bq.pR2[uVar23].f32;
          *(float *)((long)pFramesOut + uVar23 * 4) = fVar28;
          pmVar13[uVar23].f32 = fVar27 * fVar4 + fVar28 * -fVar2 + fVar5;
          pmVar14[uVar18].bq.pR2[uVar23].f32 = fVar4 * fVar1 + fVar28 * -fVar3;
        }
      }
      pFramesOut = (void *)((long)pFramesOut + (ulong)pHPF->channels * 4);
      pFramesIn = (void *)((long)pFramesIn + (ulong)pHPF->channels * 4);
    }
  }
  else {
    if (pHPF->format != ma_format_s16) {
      return MA_INVALID_OPERATION;
    }
    for (uVar19 = 0; uVar19 < frameCount; uVar19 = (ulong)((int)uVar19 + 1)) {
      memcpy(pFramesOut,pFramesIn,
             (ulong)(*(int *)(&DAT_00176420 + (ulong)pHPF->format * 4) * pHPF->channels));
      for (uVar18 = 0; uVar18 < pHPF->hpf1Count; uVar18 = uVar18 + 1) {
        pmVar12 = pHPF->pHPF1;
        uVar6 = pmVar12[uVar18].channels;
        iVar7 = pmVar12[uVar18].a.s32;
        for (uVar23 = 0; uVar6 != uVar23; uVar23 = uVar23 + 1) {
          pmVar13 = pmVar12[uVar18].pR1;
          iVar24 = pmVar13[uVar23].s32 * (iVar7 + -0x4000) +
                   *(short *)((long)pFramesOut + uVar23 * 2) * iVar7 >> 0xe;
          *(short *)((long)pFramesOut + uVar23 * 2) = (short)iVar24;
          pmVar13[uVar23].s32 = iVar24;
        }
      }
      for (uVar18 = 0; uVar18 < pHPF->hpf2Count; uVar18 = uVar18 + 1) {
        pmVar14 = pHPF->pHPF2;
        uVar6 = pmVar14[uVar18].bq.channels;
        iVar7 = pmVar14[uVar18].bq.b0.s32;
        iVar24 = pmVar14[uVar18].bq.b1.s32;
        iVar8 = pmVar14[uVar18].bq.b2.s32;
        iVar9 = pmVar14[uVar18].bq.a1.s32;
        iVar10 = pmVar14[uVar18].bq.a2.s32;
        for (uVar23 = 0; uVar6 != uVar23; uVar23 = uVar23 + 1) {
          pmVar13 = pmVar14[uVar18].bq.pR1;
          iVar25 = (int)*(short *)((long)pFramesOut + uVar23 * 2);
          iVar21 = iVar7 * iVar25 + pmVar13[uVar23].s32 >> 0xe;
          iVar11 = pmVar14[uVar18].bq.pR2[uVar23].s32;
          iVar15 = iVar9 * iVar21;
          iVar16 = iVar21 * iVar10;
          if (0x7ffe < iVar21) {
            iVar21 = 0x7fff;
          }
          uVar20 = (undefined2)iVar21;
          if (iVar21 < -0x7fff) {
            uVar20 = 0x8000;
          }
          *(undefined2 *)((long)pFramesOut + uVar23 * 2) = uVar20;
          pmVar13[uVar23].s32 = (iVar24 * iVar25 + iVar11) - iVar15;
          pmVar14[uVar18].bq.pR2[uVar23].s32 = iVar25 * iVar8 - iVar16;
        }
      }
      pFramesOut = (void *)((long)pFramesOut + (ulong)pHPF->channels * 2);
      pFramesIn = (void *)((long)pFramesIn + (ulong)pHPF->channels * 2);
    }
  }
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_hpf_process_pcm_frames(ma_hpf* pHPF, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_result result;
    ma_uint32 ihpf1;
    ma_uint32 ihpf2;

    if (pHPF == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Faster path for in-place. */
    if (pFramesOut == pFramesIn) {
        for (ihpf1 = 0; ihpf1 < pHPF->hpf1Count; ihpf1 += 1) {
            result = ma_hpf1_process_pcm_frames(&pHPF->pHPF1[ihpf1], pFramesOut, pFramesOut, frameCount);
            if (result != MA_SUCCESS) {
                return result;
            }
        }

        for (ihpf2 = 0; ihpf2 < pHPF->hpf2Count; ihpf2 += 1) {
            result = ma_hpf2_process_pcm_frames(&pHPF->pHPF2[ihpf2], pFramesOut, pFramesOut, frameCount);
            if (result != MA_SUCCESS) {
                return result;
            }
        }
    }

    /* Slightly slower path for copying. */
    if (pFramesOut != pFramesIn) {
        ma_uint32 iFrame;

        /*  */ if (pHPF->format == ma_format_f32) {
            /* */ float* pFramesOutF32 = (      float*)pFramesOut;
            const float* pFramesInF32  = (const float*)pFramesIn;

            for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                MA_COPY_MEMORY(pFramesOutF32, pFramesInF32, ma_get_bytes_per_frame(pHPF->format, pHPF->channels));

                for (ihpf1 = 0; ihpf1 < pHPF->hpf1Count; ihpf1 += 1) {
                    ma_hpf1_process_pcm_frame_f32(&pHPF->pHPF1[ihpf1], pFramesOutF32, pFramesOutF32);
                }

                for (ihpf2 = 0; ihpf2 < pHPF->hpf2Count; ihpf2 += 1) {
                    ma_hpf2_process_pcm_frame_f32(&pHPF->pHPF2[ihpf2], pFramesOutF32, pFramesOutF32);
                }

                pFramesOutF32 += pHPF->channels;
                pFramesInF32  += pHPF->channels;
            }
        } else if (pHPF->format == ma_format_s16) {
            /* */ ma_int16* pFramesOutS16 = (      ma_int16*)pFramesOut;
            const ma_int16* pFramesInS16  = (const ma_int16*)pFramesIn;

            for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                MA_COPY_MEMORY(pFramesOutS16, pFramesInS16, ma_get_bytes_per_frame(pHPF->format, pHPF->channels));

                for (ihpf1 = 0; ihpf1 < pHPF->hpf1Count; ihpf1 += 1) {
                    ma_hpf1_process_pcm_frame_s16(&pHPF->pHPF1[ihpf1], pFramesOutS16, pFramesOutS16);
                }

                for (ihpf2 = 0; ihpf2 < pHPF->hpf2Count; ihpf2 += 1) {
                    ma_hpf2_process_pcm_frame_s16(&pHPF->pHPF2[ihpf2], pFramesOutS16, pFramesOutS16);
                }

                pFramesOutS16 += pHPF->channels;
                pFramesInS16  += pHPF->channels;
            }
        } else {
            MA_ASSERT(MA_FALSE);
            return MA_INVALID_OPERATION;    /* Should never hit this. */
        }
    }

    return MA_SUCCESS;
}